

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dino.c
# Opt level: O1

void params_enumerate(DHANDLE dhandle,dino_enum_func callback,void *obj)

{
  long lVar1;
  dino_http_data_t *ptr;
  DHANDLE local_48;
  dino_callback_param_t callback_data;
  
  if ((dhandle == (DHANDLE)0x0) || (*dhandle != 2)) {
    lVar1 = 0;
  }
  else {
    lVar1 = (long)dhandle + 8;
  }
  if (lVar1 != 0) {
    memory_clear(&local_48,0x18);
    local_48 = dhandle;
    callback_data.dhandle = callback;
    callback_data.callback = (dino_enum_func)obj;
    dino_strmap_enum(*(str_map_t **)(lVar1 + 0x20),param_enum,&local_48);
  }
  return;
}

Assistant:

void DINO_EXPORT params_enumerate(DHANDLE dhandle, dino_enum_func callback, const void *obj) {
    dino_http_request_t *request = cast_dhandle_request(dhandle);

    if (NULL != request) {
        dino_callback_param_t callback_data;
        memory_clear(&callback_data, sizeof(dino_callback_param_t));
        callback_data.callback = callback;
        callback_data.dhandle = dhandle;
        callback_data.obj = obj;

        dino_strmap_enum(request->params_map, param_enum, &callback_data);

    }
}